

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_sendrecv(Curl_easy *data,curltime *nowp)

{
  curltime *data_00;
  _Bool _Var1;
  int iVar2;
  CURLcode CVar3;
  timediff_t tVar4;
  curltime newer;
  curltime newer_00;
  curltime older;
  curltime older_00;
  curltime now;
  int local_28;
  CURLcode local_24;
  int didwhat;
  CURLcode result;
  SingleRequest *k;
  curltime *nowp_local;
  Curl_easy *data_local;
  
  _didwhat = &data->req;
  local_24 = 0;
  local_28 = 0;
  k = (SingleRequest *)nowp;
  nowp_local = (curltime *)data;
  if ((data->state).select_bits != '\0') {
    iVar2 = select_bits_paused(data,(uint)(data->state).select_bits);
    if (iVar2 != 0) {
      return CURLE_OK;
    }
    nowp_local[0x13b].field_0xd = 0;
  }
  if ((_didwhat->keepon & 1U) != 0) {
    CVar3 = sendrecv_dl((Curl_easy *)nowp_local,_didwhat,&local_28);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    if ((*(uint *)((long)&nowp_local[0x18].tv_usec + 1) >> 1 & 1) != 0) {
      return CURLE_OK;
    }
    local_24 = 0;
  }
  _Var1 = Curl_req_want_send((Curl_easy *)nowp_local);
  if ((_Var1) || ((nowp_local[0x10].tv_sec & 0x4000000000) != 0)) {
    CVar3 = sendrecv_ul((Curl_easy *)nowp_local,&local_28);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    local_24 = 0;
  }
  if (local_28 == 0) {
    CVar3 = Curl_conn_ev_data_idle((Curl_easy *)nowp_local);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    local_24 = 0;
  }
  iVar2 = Curl_pgrsUpdate((Curl_easy *)nowp_local);
  if (iVar2 == 0) {
    now._12_4_ = 0;
    now._0_12_ = *(undefined1 (*) [12])k;
    local_24 = Curl_speedcheck((Curl_easy *)nowp_local,now);
  }
  else {
    local_24 = CURLE_ABORTED_BY_CALLBACK;
  }
  if (local_24 == CURLE_OK) {
    if (_didwhat->keepon == 0) {
      if (((((*(uint *)((long)&nowp_local[0x18].tv_usec + 1) >> 0x11 & 1) == 0) &&
           (_didwhat->size != -1)) && (_didwhat->bytecount != _didwhat->size)) &&
         (_didwhat->newurl == (char *)0x0)) {
        Curl_failf((Curl_easy *)nowp_local,"transfer closed with %ld bytes remaining to read",
                   _didwhat->size - _didwhat->bytecount);
        return CURLE_PARTIAL_FILE;
      }
      iVar2 = Curl_pgrsUpdate((Curl_easy *)nowp_local);
      if (iVar2 != 0) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
    }
    else {
      tVar4 = Curl_timeleft((Curl_easy *)nowp_local,(curltime *)k,false);
      data_00 = nowp_local;
      if (tVar4 < 0) {
        if (_didwhat->size == -1) {
          newer_00._12_4_ = 0;
          newer_00._0_12_ = *(undefined1 (*) [12])k;
          older_00._12_4_ = 0;
          older_00._0_12_ = *(undefined1 (*) [12])&nowp_local[0xb2].tv_usec;
          tVar4 = Curl_timediff(newer_00,older_00);
          Curl_failf((Curl_easy *)data_00,
                     "Operation timed out after %ld milliseconds with %ld bytes received",tVar4,
                     _didwhat->bytecount);
        }
        else {
          newer._12_4_ = 0;
          newer._0_12_ = *(undefined1 (*) [12])k;
          older._12_4_ = 0;
          older._0_12_ = *(undefined1 (*) [12])&nowp_local[0xb2].tv_usec;
          tVar4 = Curl_timediff(newer,older);
          Curl_failf((Curl_easy *)data_00,
                     "Operation timed out after %ld milliseconds with %ld out of %ld bytes received"
                     ,tVar4,_didwhat->bytecount,_didwhat->size);
        }
        return CURLE_OPERATION_TIMEDOUT;
      }
    }
    if ((_didwhat->keepon & 0x3fU) == 0) {
      *(uint *)((long)&nowp_local[0x18].tv_usec + 1) =
           *(uint *)((long)&nowp_local[0x18].tv_usec + 1) & 0xfffffffd | 2;
    }
    return local_24;
  }
  return local_24;
}

Assistant:

CURLcode Curl_sendrecv(struct Curl_easy *data, struct curltime *nowp)
{
  struct SingleRequest *k = &data->req;
  CURLcode result = CURLE_OK;
  int didwhat = 0;

  DEBUGASSERT(nowp);
  if(data->state.select_bits) {
    if(select_bits_paused(data, data->state.select_bits)) {
      /* leave the bits unchanged, so they'll tell us what to do when
       * this transfer gets unpaused. */
      result = CURLE_OK;
      goto out;
    }
    data->state.select_bits = 0;
  }

  /* We go ahead and do a read if we have a readable socket or if the stream
     was rewound (in which case we have data in a buffer) */
  if(k->keepon & KEEP_RECV) {
    result = sendrecv_dl(data, k, &didwhat);
    if(result || data->req.done)
      goto out;
  }

  /* If we still have writing to do, we check if we have a writable socket. */
  if(Curl_req_want_send(data) || (data->req.keepon & KEEP_SEND_TIMED)) {
    result = sendrecv_ul(data, &didwhat);
    if(result)
      goto out;
  }

  if(!didwhat) {
    /* Transfer wanted to send/recv, but nothing was possible. */
    result = Curl_conn_ev_data_idle(data);
    if(result)
      goto out;
  }

  if(Curl_pgrsUpdate(data))
    result = CURLE_ABORTED_BY_CALLBACK;
  else
    result = Curl_speedcheck(data, *nowp);
  if(result)
    goto out;

  if(k->keepon) {
    if(0 > Curl_timeleft(data, nowp, FALSE)) {
      if(k->size != -1) {
        failf(data, "Operation timed out after %" FMT_TIMEDIFF_T
              " milliseconds with %" FMT_OFF_T " out of %"
              FMT_OFF_T " bytes received",
              Curl_timediff(*nowp, data->progress.t_startsingle),
              k->bytecount, k->size);
      }
      else {
        failf(data, "Operation timed out after %" FMT_TIMEDIFF_T
              " milliseconds with %" FMT_OFF_T " bytes received",
              Curl_timediff(*nowp, data->progress.t_startsingle),
              k->bytecount);
      }
      result = CURLE_OPERATION_TIMEDOUT;
      goto out;
    }
  }
  else {
    /*
     * The transfer has been performed. Just make some general checks before
     * returning.
     */
    if(!(data->req.no_body) && (k->size != -1) &&
       (k->bytecount != k->size) && !k->newurl) {
      failf(data, "transfer closed with %" FMT_OFF_T
            " bytes remaining to read", k->size - k->bytecount);
      result = CURLE_PARTIAL_FILE;
      goto out;
    }
    if(Curl_pgrsUpdate(data)) {
      result = CURLE_ABORTED_BY_CALLBACK;
      goto out;
    }
  }

  /* If there is nothing more to send/recv, the request is done */
  if(0 == (k->keepon&(KEEP_RECVBITS|KEEP_SENDBITS)))
    data->req.done = TRUE;

out:
  if(result)
    DEBUGF(infof(data, "Curl_sendrecv() -> %d", result));
  return result;
}